

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

void __thiscall CConnman::DumpAddresses(CConnman *this)

{
  bool bVar1;
  LogFlags flag;
  long in_RDI;
  long in_FS_OFFSET;
  ConstevalFormatString<2U> in_stack_00000008;
  undefined1 in_stack_00000010 [16];
  string_view in_stack_00000020;
  time_point start;
  Level in_stack_00000100;
  unsigned_long *in_stack_00000110;
  long *in_stack_00000118;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffff60;
  duration<long,_std::ratio<1L,_1000000000L>_> in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff78;
  _Optional_payload_base<Network> net;
  AddrMan *in_stack_ffffffffffffff88;
  ArgsManager *in_stack_ffffffffffffff90;
  optional<bool> local_42;
  int in_stack_ffffffffffffffcc;
  optional<Network> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::chrono::_V2::steady_clock::now();
  DumpPeerAddresses(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  bVar1 = ::LogAcceptCategory(CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),Trace);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    net = *(_Optional_payload_base<Network> *)(in_RDI + 0xb0);
    std::optional<Network>::optional(&local_10);
    std::optional<bool>::optional(&local_42);
    flag = AddrMan::Size((AddrMan *)in_stack_ffffffffffffff60,(optional<Network>)net,
                         (_Optional_base<bool,_true,_true>)
                         SUB82((ulong)in_stack_ffffffffffffff68.__r >> 0x30,0));
    std::chrono::_V2::steady_clock::now();
    std::chrono::operator-
              (in_stack_ffffffffffffff60,
               (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    Ticks<std::chrono::duration<long,std::ratio<1l,1000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
              (in_stack_ffffffffffffff68);
    LogPrintFormatInternal<unsigned_long,long>
              (in_stack_00000020,(string_view)in_stack_00000010,in_stack_ffffffffffffffcc,flag,
               in_stack_00000100,in_stack_00000008,in_stack_00000110,in_stack_00000118);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CConnman::DumpAddresses()
{
    const auto start{SteadyClock::now()};

    DumpPeerAddresses(::gArgs, addrman);

    LogDebug(BCLog::NET, "Flushed %d addresses to peers.dat  %dms\n",
             addrman.Size(), Ticks<std::chrono::milliseconds>(SteadyClock::now() - start));
}